

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O3

void print_ops(void)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  u32 *puVar4;
  u32 *puVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  char *__format;
  uint uVar9;
  char mnemonic [100];
  U32Pair pairs [512];
  char acStack_10a8 [112];
  uint local_1038 [1026];
  
  puVar4 = emulator_get_opcode_count();
  puVar5 = emulator_get_cb_opcode_count();
  uVar8 = 0;
  memset(local_1038,0,0x1000);
  uVar6 = 0xfffffffffffffffe;
  do {
    local_1038[uVar6 * 2 + 4] = uVar8;
    local_1038[uVar6 * 2 + 5] = *(uint *)((long)puVar4 + uVar6 * 2 + 4);
    local_1038[uVar6 * 2 + 6] = uVar8 | 0xcb00;
    local_1038[uVar6 * 2 + 7] = *(uint *)((long)puVar5 + uVar6 * 2 + 4);
    uVar6 = uVar6 + 2;
    uVar8 = uVar8 + 1;
  } while (uVar6 < 0x1fe);
  qsort(local_1038,0x200,8,compare_pair);
  puts("  op:      count -   mnemonic");
  puts("--------------------------------");
  uVar6 = 0;
  bVar1 = false;
  uVar8 = 0;
  lVar7 = 0;
  do {
    uVar3 = local_1038[uVar6 * 2 + 1];
    if (uVar3 != 0) {
      bVar2 = true;
      if (uVar6 < s_print_ops_limit) {
        uVar3 = local_1038[uVar6 * 2];
        uVar9 = uVar3 & 0xffff;
        if (uVar9 == 0xcb) goto LAB_0011791f;
        __format = "%04x";
        if (uVar9 < 0x100) {
          __format = "  %02x";
        }
        printf(__format,(ulong)uVar9);
        emulator_get_opcode_mnemonic((u16)uVar3,acStack_10a8,100);
        printf(": %10d - %s\n",(ulong)local_1038[uVar6 * 2 + 1],acStack_10a8);
        uVar3 = local_1038[uVar6 * 2 + 1];
        bVar2 = bVar1;
      }
      bVar1 = bVar2;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + (ulong)uVar3;
    }
LAB_0011791f:
    uVar6 = uVar6 + 1;
    if (uVar6 == 0x200) {
      if (bVar1) {
        puts("  ...");
      }
      printf("distinct: %d\n",(ulong)uVar8);
      printf("total: %lu\n",lVar7);
      return;
    }
  } while( true );
}

Assistant:

void print_ops(void) {
  u32* opcode_count = emulator_get_opcode_count();
  u32* cb_opcode_count = emulator_get_cb_opcode_count();

  U32Pair pairs[512];
  ZERO_MEMORY(pairs);

  u32 i;
  for (i = 0; i < 512; i += 2) {
    u8 op = i / 2;
    pairs[i].value = op;
    pairs[i].count = opcode_count[op];
    pairs[i + 1].value = 0xcb00 | op;
    pairs[i + 1].count = cb_opcode_count[op];
  }

  qsort(pairs, ARRAY_SIZE(pairs), sizeof(pairs[0]), compare_pair);

  printf("  op:      count -   mnemonic\n");
  printf("--------------------------------\n");
  char mnemonic[100];
  u64 total = 0;
  int distinct = 0;
  Bool skipped = FALSE;
  for (i = 0; i < 512; ++i) {
    if (pairs[i].count > 0) {
      u16 opcode = pairs[i].value;
      if (i < s_print_ops_limit) {
        if (opcode == 0xcb) continue;
        if (opcode < 0x100) {
          printf("  %02x", opcode);
        } else {
          printf("%04x", opcode);
        }
        emulator_get_opcode_mnemonic(opcode, mnemonic, sizeof(mnemonic));
        printf(": %10d - %s\n", pairs[i].count, mnemonic);
      } else {
        skipped = TRUE;
      }
      ++distinct;
      total += pairs[i].count;
    }
  }
  if (skipped) {
    printf("  ...\n");
  }
  printf("distinct: %d\n", distinct);
  printf("total: %" PRIu64 "\n", total);
}